

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockDXT.cpp
# Opt level: O0

void __thiscall nv::AlphaBlockDXT5::evaluatePalette8(AlphaBlockDXT5 *this,uint8 *alpha)

{
  uint8 *alpha_local;
  AlphaBlockDXT5 *this_local;
  
  *alpha = (uint8)(this->field_0).u;
  alpha[1] = (uint8)((this->field_0).u >> 8);
  alpha[2] = (uint8)((ulong)(long)(int)((uint)*alpha * 6 + (uint)alpha[1]) / 7);
  alpha[3] = (uint8)((ulong)((uint)*alpha * 5 + (uint)alpha[1] * 2) / 7);
  alpha[4] = (uint8)((ulong)(long)(int)((uint)*alpha * 4 + (uint)alpha[1] * 3) / 7);
  alpha[5] = (uint8)((ulong)(long)(int)((uint)*alpha * 3 + (uint)alpha[1] * 4) / 7);
  alpha[6] = (uint8)((ulong)((uint)*alpha * 2 + (uint)alpha[1] * 5) / 7);
  alpha[7] = (uint8)((ulong)(long)(int)((uint)*alpha + (uint)alpha[1] * 6) / 7);
  return;
}

Assistant:

void AlphaBlockDXT5::evaluatePalette8(uint8 alpha[8]) const
{
	// 8-alpha block:  derive the other six alphas.
	// Bit code 000 = alpha0, 001 = alpha1, others are interpolated.
	alpha[0] = alpha0;
	alpha[1] = alpha1;
	alpha[2] = (6 * alpha[0] + 1 * alpha[1]) / 7;	// bit code 010
	alpha[3] = (5 * alpha[0] + 2 * alpha[1]) / 7;	// bit code 011
	alpha[4] = (4 * alpha[0] + 3 * alpha[1]) / 7;	// bit code 100
	alpha[5] = (3 * alpha[0] + 4 * alpha[1]) / 7;	// bit code 101
	alpha[6] = (2 * alpha[0] + 5 * alpha[1]) / 7;	// bit code 110
	alpha[7] = (1 * alpha[0] + 6 * alpha[1]) / 7;	// bit code 111
}